

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request,uint16_t *compress_algos,
              size_t num_compress_algos)

{
  _func_int_st_ptls_sign_certificate_t_ptr_ptls_t_ptr_uint16_t_ptr_ptls_buffer_t_ptr_ptls_iovec_t_uint16_t_ptr_size_t
  *p_Var1;
  size_t sVar2;
  ptls_buffer_t *ppVar3;
  int iVar4;
  size_t sVar5;
  uint8_t *in_RCX;
  long in_RDX;
  ptls_message_emitter_t *in_RSI;
  ptls_t *in_RDI;
  size_t in_R8;
  ptls_iovec_t pVar6;
  int in_stack_00000008;
  uint16_t *in_stack_00000010;
  ptls_buffer_t *in_stack_00000018;
  size_t body_size;
  size_t body_size_1;
  size_t datalen;
  uint8_t data [226];
  uint16_t algo;
  size_t body_start_1;
  size_t capacity_1;
  uint16_t _v;
  size_t algo_off;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  ptls_emit_certificate_t *emit_certificate;
  int ret;
  size_t in_stack_fffffffffffffdd8;
  uint16_t *src;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *in_stack_fffffffffffffdf0;
  ptls_key_schedule_t *in_stack_fffffffffffffdf8;
  ptls_buffer_t *buf_00;
  uint8_t *in_stack_fffffffffffffe00;
  ptls_emit_certificate_t *local_1c8;
  uint8_t *local_1b0;
  size_t local_1a8;
  undefined1 local_198 [238];
  undefined1 local_aa [2];
  size_t local_a8;
  long local_a0;
  undefined1 local_94;
  undefined1 local_93;
  undefined2 local_92;
  size_t local_90;
  ptls_buffer_t *local_88;
  size_t local_80;
  long local_78;
  undefined1 local_69;
  size_t local_68;
  ptls_key_schedule_t *local_60;
  ptls_buffer_t *local_58;
  st_ptls_message_emitter_t *local_50;
  ptls_emit_certificate_t *local_48;
  int local_3c;
  long local_30;
  ptls_message_emitter_t *local_28;
  ptls_t *local_20;
  uint8_t *local_18;
  size_t local_10;
  
  if (*(long *)(in_RDX + 0x20) == 0) {
    local_3c = 0x6d;
    iVar4 = local_3c;
  }
  else {
    if (in_RDI->ctx->emit_certificate == (ptls_emit_certificate_t *)0x0) {
      local_1c8 = &send_certificate_and_certificate_verify::default_emit_certificate;
    }
    else {
      local_1c8 = in_RDI->ctx->emit_certificate;
    }
    local_48 = local_1c8;
    local_30 = in_RDX;
    local_28 = in_RSI;
    local_20 = in_RDI;
    local_18 = in_RCX;
    local_10 = in_R8;
    while( true ) {
      pVar6.len = local_10;
      pVar6.base = local_18;
      in_stack_fffffffffffffdd8 =
           CONCAT44((int)(in_stack_fffffffffffffdd8 >> 0x20),in_stack_00000008);
      src = in_stack_00000010;
      buf = in_stack_00000018;
      local_3c = (*local_48->cb)(local_48,local_20,local_28,local_20->key_schedule,pVar6,
                                 in_stack_00000008,in_stack_00000010,(size_t)in_stack_00000018);
      if (local_3c == 0) break;
      if (local_3c != 0x20a) {
        return local_3c;
      }
      if (local_48 == &send_certificate_and_certificate_verify::default_emit_certificate) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xa7d,
                      "int send_certificate_and_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, const char *, int, const uint16_t *, size_t)"
                     );
      }
      local_48 = &send_certificate_and_certificate_verify::default_emit_certificate;
      local_3c = 0x20a;
    }
    iVar4 = 0;
    if (local_20->ctx->sign_certificate != (ptls_sign_certificate_t *)0x0) {
      local_50 = local_28;
      local_3c = (*local_28->begin_message)(local_28);
      iVar4 = local_3c;
      if (local_3c == 0) {
        local_58 = local_50->buf;
        local_60 = local_20->key_schedule;
        local_68 = local_58->off;
        local_69 = 0xf;
        local_3c = ptls_buffer__do_pushv(buf,src,in_stack_fffffffffffffdd8);
        iVar4 = local_3c;
        if (local_3c == 0) {
          local_78 = 3;
          local_3c = ptls_buffer__do_pushv(buf,src,in_stack_fffffffffffffdd8);
          iVar4 = local_3c;
          if (local_3c == 0) {
            local_80 = local_58->off;
            local_88 = local_28->buf;
            local_90 = local_88->off;
            local_92 = 0;
            local_94 = 0;
            local_93 = 0;
            local_3c = ptls_buffer__do_pushv(buf,src,in_stack_fffffffffffffdd8);
            iVar4 = local_3c;
            if (local_3c == 0) {
              local_a0 = 2;
              local_3c = ptls_buffer__do_pushv(buf,src,in_stack_fffffffffffffdd8);
              iVar4 = local_3c;
              if (local_3c == 0) {
                local_a8 = local_88->off;
                sVar5 = build_certificate_verify_signdata
                                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                                   (char *)in_stack_fffffffffffffdf0);
                ppVar3 = local_88;
                p_Var1 = local_20->ctx->sign_certificate->cb;
                buf_00 = (ptls_buffer_t *)local_20->ctx->sign_certificate;
                pVar6 = ptls_iovec_init(local_198,sVar5);
                sVar5 = *(size_t *)(local_30 + 0x20);
                local_1b0 = pVar6.base;
                local_1a8 = pVar6.len;
                local_3c = (*p_Var1)(buf_00,local_20,local_aa,ppVar3,local_1b0,local_1a8,local_30);
                iVar4 = local_3c;
                if (local_3c == 0) {
                  local_88->base[local_90] = local_aa[1];
                  local_88->base[local_90 + 1] = local_aa[0];
                  sVar2 = local_88->off;
                  if (local_a0 == -1) {
                    iVar4 = ptls_buffer__adjust_quic_blocksize
                                      (buf_00,(size_t)in_stack_fffffffffffffdf0);
                    if (iVar4 != 0) {
                      return iVar4;
                    }
                  }
                  else {
                    for (; local_a0 != 0; local_a0 = local_a0 + -1) {
                      local_88->base[local_a8 - local_a0] =
                           (uint8_t)(sVar2 - local_a8 >> (((char)local_a0 + -1) * '\b' & 0x3fU));
                    }
                  }
                  local_3c = 0;
                  sVar2 = local_58->off;
                  if (local_78 == -1) {
                    iVar4 = ptls_buffer__adjust_quic_blocksize
                                      (buf_00,(size_t)in_stack_fffffffffffffdf0);
                    if (iVar4 != 0) {
                      return iVar4;
                    }
                  }
                  else {
                    for (; local_78 != 0; local_78 = local_78 + -1) {
                      local_58->base[local_80 - local_78] =
                           (uint8_t)(sVar2 - local_80 >> (((char)local_78 + -1) * '\b' & 0x3fU));
                    }
                  }
                  local_3c = 0;
                  if (local_60 != (ptls_key_schedule_t *)0x0) {
                    ptls__key_schedule_update_hash(in_stack_fffffffffffffdf0,(uint8_t *)buf,sVar5);
                  }
                  iVar4 = (*local_50->commit_message)(local_50);
                }
              }
            }
          }
        }
      }
    }
  }
  local_3c = iVar4;
  return local_3c;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request,
                                                   const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
            ptls_buffer_t *sendbuf = emitter->buf;
            size_t algo_off = sendbuf->off;
            ptls_buffer_push16(sendbuf, 0); /* filled in later */
            ptls_buffer_push_block(sendbuf, 2, {
                uint16_t algo;
                uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                          ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                          signature_algorithms->count)) != 0) {
                    goto Exit;
                }
                sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                sendbuf->base[algo_off + 1] = (uint8_t)algo;
            });
        });
    }

Exit:
    return ret;
}